

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall cfd::core::Psbt::Psbt(Psbt *this,uint32_t psbt_version,Transaction *transaction)

{
  pointer *this_00;
  wally_tx *pwVar1;
  int iVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  char *hex;
  CfdException *pCVar6;
  size_type sVar7;
  size_type sVar8;
  reference pTVar9;
  reference pTVar10;
  uint64_t satoshi;
  uchar *puVar11;
  Amount AVar12;
  Transaction local_440;
  undefined1 local_3fa;
  allocator local_3f9;
  string local_3f8;
  CfdSourceLocation local_3d8;
  undefined1 local_3ba;
  allocator local_3b9;
  string local_3b8;
  CfdSourceLocation local_398;
  int64_t local_380;
  undefined1 local_378;
  Amount local_370;
  Script local_360;
  ByteData local_328;
  undefined1 local_310 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  TxOutReference txout;
  iterator __end3_1;
  iterator __begin3_1;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *__range3_1;
  string local_288;
  CfdSourceLocation local_268;
  Txid local_250;
  ByteData local_230;
  undefined1 local_218 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> txid_val;
  TxInReference txin;
  iterator __end3;
  iterator __begin3;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *__range3;
  string local_150;
  CfdSourceLocation local_130;
  undefined1 local_112;
  allocator local_111;
  string local_110;
  CfdSourceLocation local_f0;
  wally_psbt *local_d8;
  wally_psbt *psbt_pointer;
  string local_c8;
  CfdSourceLocation local_a8;
  int local_8c;
  wally_tx *pwStack_88;
  int ret;
  wally_tx *tx;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txout_list;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> txin_list;
  undefined1 local_40 [8];
  string tx_hex;
  Transaction *transaction_local;
  uint32_t psbt_version_local;
  Psbt *this_local;
  
  this->_vptr_Psbt = (_func_int **)&PTR__Psbt_008965b8;
  tx_hex.field_2._8_8_ = transaction;
  Transaction::Transaction(&this->base_tx_);
  AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_40,(AbstractTransaction *)tx_hex.field_2._8_8_);
  Transaction::GetTxInList
            ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
             &txout_list.
              super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Transaction *)tx_hex.field_2._8_8_
            );
  Transaction::GetTxOutList
            ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)&tx,
             (Transaction *)tx_hex.field_2._8_8_);
  pwStack_88 = (wally_tx *)0x0;
  hex = (char *)::std::__cxx11::string::data();
  local_8c = wally_tx_from_hex(hex,0,&stack0xffffffffffffff78);
  if (local_8c == 0) {
    sVar7 = pwStack_88->num_inputs;
    sVar8 = ::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::size
                      ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                        *)&txout_list.
                           super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((sVar7 != sVar8) ||
       (sVar7 = pwStack_88->num_outputs,
       sVar8 = ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
               ::size((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                       *)&tx), sVar7 != sVar8)) {
      wally_tx_free(pwStack_88);
      pwStack_88 = (wally_tx *)0x0;
    }
  }
  else {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x727;
    local_a8.funcname = "Psbt";
    logger::warn<int&>(&local_a8,"wally_tx_from_hex NG[{}]",&local_8c);
    bVar3 = ::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
            empty((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                  &txout_list.
                   super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((!bVar3) &&
       (bVar3 = ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                ::empty((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                         *)&tx), !bVar3)) {
      psbt_pointer._6_1_ = 1;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_c8,"psbt tx from hex error.",
                 (allocator *)((long)&psbt_pointer + 7));
      CfdException::CfdException(pCVar6,kCfdInternalError,&local_c8);
      psbt_pointer._6_1_ = 0;
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  local_d8 = (wally_psbt *)0x0;
  sVar7 = ::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::size
                    ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                     &txout_list.
                      super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar8 = ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::size
                    ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                      *)&tx);
  local_8c = wally_psbt_init_alloc(psbt_version,sVar7,sVar8,0,&local_d8);
  if (local_8c != 0) {
    local_f0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_f0.filename = local_f0.filename + 1;
    local_f0.line = 0x739;
    local_f0.funcname = "Psbt";
    logger::warn<int&>(&local_f0,"wally_psbt_init_alloc NG[{}]",&local_8c);
    local_112 = 1;
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_110,"psbt data generate error.",&local_111);
    CfdException::CfdException(pCVar6,kCfdInternalError,&local_110);
    local_112 = 0;
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar2 = 0;
  if (pwStack_88 == (wally_tx *)0x0) {
    uVar4 = AbstractTransaction::GetVersion((AbstractTransaction *)tx_hex.field_2._8_8_);
    uVar5 = AbstractTransaction::GetLockTime((AbstractTransaction *)tx_hex.field_2._8_8_);
    sVar7 = ::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::size
                      ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                        *)&txout_list.
                           super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar8 = ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::
            size((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 &tx);
    local_8c = wally_tx_init_alloc(uVar4,uVar5,sVar7,sVar8,&stack0xffffffffffffff78);
    if (local_8c != 0) {
      wally_psbt_free(local_d8);
      local_130.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_130.filename = local_130.filename + 1;
      local_130.line = 0x743;
      local_130.funcname = "Psbt";
      logger::warn<int&>(&local_130,"wally_psbt_set_global_tx NG[{}]",&local_8c);
      __range3._6_1_ = 1;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_150,"psbt set tx error.",(allocator *)((long)&__range3 + 7));
      CfdException::CfdException(pCVar6,kCfdInternalError,&local_150);
      __range3._6_1_ = 0;
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    this_00 = &txout_list.
               super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end3 = ::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
             begin((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                   this_00);
    txin.super_AbstractTxInReference.script_witness_.witness_stack_.
    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                  ::end((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                         *)this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                                       *)((long)&txin.super_AbstractTxInReference.script_witness_.
                                                 witness_stack_.
                                                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                                 ._M_impl.super__Vector_impl_data + 0x10)), bVar3) {
      pTVar9 = __gnu_cxx::
               __normal_iterator<cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
               ::operator*(&__end3);
      TxInReference::TxInReference
                ((TxInReference *)
                 &txid_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,pTVar9);
      AbstractTxInReference::GetTxid
                (&local_250,
                 (AbstractTxInReference *)
                 &txid_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      Txid::GetData(&local_230,&local_250);
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218,
                         &local_230);
      ByteData::~ByteData(&local_230);
      Txid::~Txid(&local_250);
      pwVar1 = pwStack_88;
      puVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218);
      sVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218);
      uVar4 = AbstractTxInReference::GetVout
                        ((AbstractTxInReference *)
                         &txid_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar5 = AbstractTxInReference::GetSequence
                        ((AbstractTxInReference *)
                         &txid_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_8c = wally_tx_add_raw_input
                           (pwVar1,puVar11,sVar7,uVar4,uVar5,(uchar *)0x0,0,
                            (wally_tx_witness_stack *)0x0,0);
      if (local_8c != 0) {
        wally_tx_free(pwStack_88);
        wally_psbt_free(local_d8);
        local_268.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_268.filename = local_268.filename + 1;
        local_268.line = 0x74f;
        local_268.funcname = "Psbt";
        logger::warn<int&>(&local_268,"wally_tx_add_raw_input NG[{}]",&local_8c);
        __range3_1._6_1_ = 1;
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_288,"psbt set tx input error.",
                   (allocator *)((long)&__range3_1 + 7));
        CfdException::CfdException(pCVar6,kCfdInternalError,&local_288);
        __range3_1._6_1_ = 0;
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218);
      TxInReference::~TxInReference
                ((TxInReference *)
                 &txid_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
      ::operator++(&__end3);
    }
    __end3_1 = ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
               ::begin((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                        *)&tx);
    txout.super_AbstractTxOutReference.locking_script_.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)::std::
                  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::end
                            ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                              *)&tx);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
                               *)((long)&txout.super_AbstractTxOutReference.locking_script_.
                                         script_stack_.
                                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                         ._M_impl.super__Vector_impl_data + 0x10)), iVar2 = local_8c
          , bVar3) {
      pTVar10 = __gnu_cxx::
                __normal_iterator<cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
                ::operator*(&__end3_1);
      TxOutReference::TxOutReference
                ((TxOutReference *)
                 &script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,pTVar10);
      AbstractTxOutReference::GetLockingScript
                (&local_360,
                 (AbstractTxOutReference *)
                 &script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      Script::GetData(&local_328,&local_360);
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_310,
                         &local_328);
      ByteData::~ByteData(&local_328);
      Script::~Script(&local_360);
      pwVar1 = pwStack_88;
      AVar12 = AbstractTxOutReference::GetValue
                         ((AbstractTxOutReference *)
                          &script_val.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      local_380 = AVar12.amount_;
      local_378 = AVar12.ignore_check_;
      local_370.amount_ = local_380;
      local_370.ignore_check_ = (bool)local_378;
      satoshi = Amount::GetSatoshiValue(&local_370);
      puVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_310);
      sVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_310);
      local_8c = wally_tx_add_raw_output(pwVar1,satoshi,puVar11,sVar7,0);
      if (local_8c != 0) {
        wally_tx_free(pwStack_88);
        wally_psbt_free(local_d8);
        local_398.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_398.filename = local_398.filename + 1;
        local_398.line = 0x75b;
        local_398.funcname = "Psbt";
        logger::warn<int&>(&local_398,"wally_tx_add_raw_output NG[{}]",&local_8c);
        local_3ba = 1;
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_3b8,"psbt set tx output error.",&local_3b9);
        CfdException::CfdException(pCVar6,kCfdInternalError,&local_3b8);
        local_3ba = 0;
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_310);
      TxOutReference::~TxOutReference
                ((TxOutReference *)
                 &script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
      ::operator++(&__end3_1);
    }
  }
  local_8c = iVar2;
  local_8c = wally_psbt_set_global_tx(local_d8,pwStack_88);
  wally_tx_free(pwStack_88);
  if (local_8c == 0) {
    this->wally_psbt_pointer_ = local_d8;
    RebuildTransaction(&local_440,this->wally_psbt_pointer_);
    Transaction::operator=(&this->base_tx_,&local_440);
    Transaction::~Transaction(&local_440);
    ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
              ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)&tx)
    ;
    ::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
              ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
               &txout_list.
                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string((string *)local_40);
    return;
  }
  wally_psbt_free(local_d8);
  local_3d8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
               ,0x2f);
  local_3d8.filename = local_3d8.filename + 1;
  local_3d8.line = 0x765;
  local_3d8.funcname = "Psbt";
  logger::warn<int&>(&local_3d8,"wally_psbt_set_global_tx NG[{}]",&local_8c);
  local_3fa = 1;
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_3f8,"psbt set tx error.",&local_3f9);
  CfdException::CfdException(pCVar6,kCfdInternalError,&local_3f8);
  local_3fa = 0;
  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, const Transaction &transaction) {
  std::string tx_hex = transaction.GetHex();
  auto txin_list = transaction.GetTxInList();
  auto txout_list = transaction.GetTxOutList();
  struct wally_tx *tx = nullptr;
  int ret = wally_tx_from_hex(tx_hex.data(), 0, &tx);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}]", ret);
    if (txin_list.empty() || txout_list.empty()) {
      // fall-through
    } else {
      throw CfdException(kCfdInternalError, "psbt tx from hex error.");
    }
  } else if (
      (tx->num_inputs != txin_list.size()) ||
      (tx->num_outputs != txout_list.size())) {
    // free and direct creating.
    wally_tx_free(tx);
    tx = nullptr;
  }

  struct wally_psbt *psbt_pointer = nullptr;
  ret = wally_psbt_init_alloc(
      psbt_version, txin_list.size(), txout_list.size(), 0, &psbt_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_init_alloc NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt data generate error.");
  }

  if (tx == nullptr) {
    ret = wally_tx_init_alloc(
        transaction.GetVersion(), transaction.GetLockTime(), txin_list.size(),
        txout_list.size(), &tx);
    if (ret != WALLY_OK) {
      wally_psbt_free(psbt_pointer);  // free
      warn(CFD_LOG_SOURCE, "wally_psbt_set_global_tx NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt set tx error.");
    }

    for (auto txin : txin_list) {
      auto txid_val = txin.GetTxid().GetData().GetBytes();
      ret = wally_tx_add_raw_input(
          tx, txid_val.data(), txid_val.size(), txin.GetVout(),
          txin.GetSequence(), nullptr, 0, nullptr, 0);
      if (ret != WALLY_OK) {
        wally_tx_free(tx);
        wally_psbt_free(psbt_pointer);  // free
        warn(CFD_LOG_SOURCE, "wally_tx_add_raw_input NG[{}]", ret);
        throw CfdException(kCfdInternalError, "psbt set tx input error.");
      }
    }
    for (auto txout : txout_list) {
      auto script_val = txout.GetLockingScript().GetData().GetBytes();
      ret = wally_tx_add_raw_output(
          tx, static_cast<uint64_t>(txout.GetValue().GetSatoshiValue()),
          script_val.data(), script_val.size(), 0);
      if (ret != WALLY_OK) {
        wally_tx_free(tx);
        wally_psbt_free(psbt_pointer);  // free
        warn(CFD_LOG_SOURCE, "wally_tx_add_raw_output NG[{}]", ret);
        throw CfdException(kCfdInternalError, "psbt set tx output error.");
      }
    }
  }

  ret = wally_psbt_set_global_tx(psbt_pointer, tx);
  wally_tx_free(tx);
  if (ret != WALLY_OK) {
    wally_psbt_free(psbt_pointer);  // free
    warn(CFD_LOG_SOURCE, "wally_psbt_set_global_tx NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt set tx error.");
  }
  wally_psbt_pointer_ = psbt_pointer;
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}